

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_60 [8];
  w_linear_alloc linear_alloc;
  w_alloc alloc;
  w_status status;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    wp_log(W_LOG_LVL_WARNING,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/cli/main.c"
           ,0x49,"no input files\n");
    argv_local._4_4_ = 0;
  }
  else {
    alloc.inst._4_4_ = w_linear_alloc_create((w_linear_alloc *)local_60,0x1000);
    if (alloc.inst._4_4_ == W_SUCCESS) {
      w_linear_alloc_get_universal_alloc((w_alloc *)&linear_alloc.used,(w_linear_alloc *)local_60);
      alloc.inst._4_4_ = w_run((w_alloc *)&linear_alloc.used,argv[1]);
      w_linear_alloc_destroy((w_linear_alloc *)local_60);
    }
    argv_local._4_4_ = (uint)(alloc.inst._4_4_ != W_SUCCESS);
  }
  return argv_local._4_4_;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    enum w_status status;
    struct w_alloc alloc;
    struct w_linear_alloc linear_alloc;

    if (argc < 2)
    {
        W_LOG_WARNING("no input files\n");
        return EXIT_SUCCESS;
    }

    status = w_linear_alloc_create(&linear_alloc, 4096);
    if (status != W_SUCCESS)
    {
        goto exit;
    }

    w_linear_alloc_get_universal_alloc(&alloc, &linear_alloc);

    status = w_run(&alloc, argv[1]);
    if (status != W_SUCCESS)
    {
        goto linear_alloc_cleanup;
    }

linear_alloc_cleanup:
    w_linear_alloc_destroy(&linear_alloc);

exit:
    return status == W_SUCCESS ? EXIT_SUCCESS : EXIT_FAILURE;
}